

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglSyncTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::egl::anon_unknown_0::GetSyncStatusTest::iterate(GetSyncStatusTest *this)

{
  deUint32 dVar1;
  deBool dVar2;
  EGLSyncKHR pvVar3;
  MessageBuilder *pMVar4;
  TestError *pTVar5;
  MessageBuilder local_340;
  int local_1bc;
  char *pcStack_1b8;
  EGLint status;
  MessageBuilder local_1a0;
  TestLog *local_20;
  TestLog *log;
  Library *egl;
  GetSyncStatusTest *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)EglTestContext::getLibrary((this->super_SyncTest).super_TestCase.m_eglTestCtx);
  local_20 = tcu::TestContext::getLog
                       ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  pvVar3 = (EGLSyncKHR)
           (*(code *)log->m_log[3].outputFile)
                     (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_syncType,0);
  (this->super_SyncTest).m_sync = pvVar3;
  tcu::TestLog::operator<<(&local_1a0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1a0,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [21])" = eglCreateSyncKHR(");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pcStack_1b8 = getSyncTypeName((this->super_SyncTest).m_syncType);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&stack0xfffffffffffffe48);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [8])0x580c83);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1a0);
  dVar1 = (*(code *)log->m_log[6].lock)();
  eglu::checkError(dVar1,"eglCreateSyncKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x2d1);
  local_1bc = 0;
  do {
    (*(code *)log->m_log[7].lock)
              (log,(this->super_SyncTest).m_eglDisplay,(this->super_SyncTest).m_sync,0x30f1,
               &local_1bc);
    dVar1 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar1,"getSyncAttribKHR(m_eglDisplay, m_sync, EGL_SYNC_STATUS_KHR, &status)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                     ,0x2d4);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  tcu::TestLog::operator<<(&local_340,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_340,(char (*) [21])0x580e2c);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_eglDisplay);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x584b6d);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&(this->super_SyncTest).m_sync);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [25])", EGL_SYNC_STATUS_KHR, {");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1bc);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [3])0x57e0e9);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_340);
  if ((this->super_SyncTest).m_syncType == 0x30f9) {
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || ((local_1bc != 0x30f2 && (local_1bc != 0x30f3)))) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,(char *)0x0,"status == EGL_SIGNALED_KHR || status == EGL_UNSIGNALED_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x2d8);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  else if ((this->super_SyncTest).m_syncType == 0x30fa) {
    do {
      dVar2 = ::deGetFalse();
      if ((dVar2 != 0) || (local_1bc != 0x30f3)) {
        pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar5,(char *)0x0,"status == EGL_UNSIGNALED_KHR",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglSyncTests.cpp"
                   ,0x2da);
        __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar2 = ::deGetFalse();
    } while (dVar2 != 0);
  }
  tcu::TestContext::setTestResult
            ((this->super_SyncTest).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

IterateResult	iterate				(void)
	{
		const Library&	egl		= m_eglTestCtx.getLibrary();
		TestLog&		log		= m_testCtx.getLog();

		m_sync = egl.createSyncKHR(m_eglDisplay, m_syncType, NULL);
		log << TestLog::Message << m_sync << " = eglCreateSyncKHR(" << m_eglDisplay << ", " << getSyncTypeName(m_syncType) << ", NULL)" << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "eglCreateSyncKHR()");

		EGLint status = 0;
		EGLU_CHECK_CALL(egl, getSyncAttribKHR(m_eglDisplay, m_sync, EGL_SYNC_STATUS_KHR, &status));
		log << TestLog::Message << "eglGetSyncAttribKHR(" << m_eglDisplay << ", " << m_sync << ", EGL_SYNC_STATUS_KHR, {" << status << "})" << TestLog::EndMessage;

		if (m_syncType == EGL_SYNC_FENCE_KHR)
			TCU_CHECK(status == EGL_SIGNALED_KHR || status == EGL_UNSIGNALED_KHR);
		else if (m_syncType == EGL_SYNC_REUSABLE_KHR)
			TCU_CHECK(status == EGL_UNSIGNALED_KHR);

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}